

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O1

CURLcode ftp_setup_connection(Curl_easy *data,connectdata *conn)

{
  curl_trc_feat *pcVar1;
  char cVar2;
  FTP *pFVar3;
  char *pcVar4;
  uint uVar5;
  CURLcode CVar6;
  CURLcode CVar7;
  
  pFVar3 = (FTP *)(*Curl_ccalloc)(1,0x20);
  CVar7 = CURLE_OUT_OF_MEMORY;
  if (pFVar3 != (FTP *)0x0) {
    pcVar4 = (data->set).str[0x22];
    if (pcVar4 != (char *)0x0) {
      pcVar4 = (*Curl_cstrdup)(pcVar4);
      (conn->proto).ftpc.account = pcVar4;
      if (pcVar4 == (char *)0x0) {
        (*Curl_cfree)(pFVar3);
        return CURLE_OUT_OF_MEMORY;
      }
    }
    pcVar4 = (data->set).str[0x23];
    if (pcVar4 != (char *)0x0) {
      pcVar4 = (*Curl_cstrdup)(pcVar4);
      (conn->proto).ftpc.alternative_to_user = pcVar4;
      if (pcVar4 == (char *)0x0) {
        (*Curl_cfree)((conn->proto).ftpc.account);
        (conn->proto).ftpc.account = (char *)0x0;
        (*Curl_cfree)(pFVar3);
        return CURLE_OUT_OF_MEMORY;
      }
    }
    (data->req).p.ftp = pFVar3;
    pcVar4 = (data->state).up.path + 1;
    pFVar3->path = pcVar4;
    pcVar4 = strstr(pcVar4,";type=");
    if (pcVar4 == (char *)0x0) {
      pcVar4 = strstr((conn->host).rawalloc,";type=");
    }
    if (pcVar4 != (char *)0x0) {
      *pcVar4 = '\0';
      cVar2 = Curl_raw_toupper(pcVar4[6]);
      uVar5 = *(uint *)&(data->state).field_0x774;
      if (cVar2 == 'D') {
        uVar5 = uVar5 | 0x2000;
      }
      else if (cVar2 == 'A') {
        uVar5 = uVar5 | 0x1000;
      }
      else {
        uVar5 = uVar5 & 0xffffefff;
      }
      *(uint *)&(data->state).field_0x774 = uVar5;
    }
    pFVar3->transfer = PPTRANSFER_BODY;
    pFVar3->downloadsize = 0;
    (conn->proto).ftpc.known_filesize = -1;
    (conn->proto).ftpc.use_ssl = (data->set).use_ssl;
    (conn->proto).ftpc.ccc = (data->set).ftp_ccc;
    CVar6 = CURLE_OK;
    CVar7 = CURLE_OK;
    if ((((data != (Curl_easy *)0x0) && (CVar7 = CVar6, ((data->set).field_0x8cd & 0x10) != 0)) &&
        ((pcVar1 = (data->state).feat, pcVar1 == (curl_trc_feat *)0x0 || (0 < pcVar1->log_level))))
       && (0 < Curl_trc_feat_ftp.log_level)) {
      if (conn == (connectdata *)0x0) {
        pcVar4 = "???";
      }
      else {
        pcVar4 = ftp_state_names[(conn->proto).ftpc.state];
      }
      CVar7 = CURLE_OK;
      Curl_trc_ftp(data,"[%s] setup connection -> %d",pcVar4,0);
    }
  }
  return CVar7;
}

Assistant:

static CURLcode ftp_setup_connection(struct Curl_easy *data,
                                     struct connectdata *conn)
{
  char *type;
  struct FTP *ftp;
  CURLcode result = CURLE_OK;
  struct ftp_conn *ftpc = &conn->proto.ftpc;

  ftp = calloc(1, sizeof(struct FTP));
  if(!ftp)
    return CURLE_OUT_OF_MEMORY;

  /* clone connection related data that is FTP specific */
  if(data->set.str[STRING_FTP_ACCOUNT]) {
    ftpc->account = strdup(data->set.str[STRING_FTP_ACCOUNT]);
    if(!ftpc->account) {
      free(ftp);
      return CURLE_OUT_OF_MEMORY;
    }
  }
  if(data->set.str[STRING_FTP_ALTERNATIVE_TO_USER]) {
    ftpc->alternative_to_user =
      strdup(data->set.str[STRING_FTP_ALTERNATIVE_TO_USER]);
    if(!ftpc->alternative_to_user) {
      Curl_safefree(ftpc->account);
      free(ftp);
      return CURLE_OUT_OF_MEMORY;
    }
  }
  data->req.p.ftp = ftp;

  ftp->path = &data->state.up.path[1]; /* do not include the initial slash */

  /* FTP URLs support an extension like ";type=<typecode>" that
   * we will try to get now! */
  type = strstr(ftp->path, ";type=");

  if(!type)
    type = strstr(conn->host.rawalloc, ";type=");

  if(type) {
    char command;
    *type = 0;                     /* it was in the middle of the hostname */
    command = Curl_raw_toupper(type[6]);

    switch(command) {
    case 'A': /* ASCII mode */
      data->state.prefer_ascii = TRUE;
      break;

    case 'D': /* directory mode */
      data->state.list_only = TRUE;
      break;

    case 'I': /* binary mode */
    default:
      /* switch off ASCII */
      data->state.prefer_ascii = FALSE;
      break;
    }
  }

  /* get some initial data into the ftp struct */
  ftp->transfer = PPTRANSFER_BODY;
  ftp->downloadsize = 0;
  ftpc->known_filesize = -1; /* unknown size for now */
  ftpc->use_ssl = data->set.use_ssl;
  ftpc->ccc = data->set.ftp_ccc;

  CURL_TRC_FTP(data, "[%s] setup connection -> %d", FTP_CSTATE(conn), result);
  return result;
}